

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O0

int open_socket(char *host,unsigned_short port)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *prVar5;
  uint16_t in_SI;
  char *in_RDI;
  stringstream msg_2;
  sockaddr_in far_end;
  stringstream msg_1;
  int sd;
  stringstream msg;
  hostent *he;
  string local_580 [32];
  stringstream local_560 [16];
  ostream local_550 [380];
  sockaddr local_3d4;
  undefined1 local_3c1;
  string local_3a0 [32];
  stringstream local_380 [16];
  ostream local_370 [376];
  int local_1f8;
  undefined1 local_1f1;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  hostent *local_18;
  uint16_t local_a;
  char *local_8;
  
  local_a = in_SI;
  local_8 = in_RDI;
  local_18 = gethostbyname(in_RDI);
  if (local_18 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"gethostbyname(");
    poVar2 = std::operator<<(poVar2,local_8);
    poVar2 = std::operator<<(poVar2,"): ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<((ostream *)&std::cerr,local_1d0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d0);
    local_1f1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::runtime_error::runtime_error(prVar5,pcVar4);
    local_1f1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8 = socket(2,1,0);
  if (local_1f8 == -1) {
    std::__cxx11::stringstream::stringstream(local_380);
    poVar2 = std::operator<<(local_370,"socket: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<((ostream *)&std::cerr,local_3a0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3a0);
    local_3c1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::runtime_error::runtime_error(prVar5,pcVar4);
    local_3c1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3d4.sa_family = 2;
  local_3d4.sa_data._0_2_ = htons(local_a);
  local_3d4.sa_data._2_4_ = *(undefined4 *)*local_18->h_addr_list;
  memset(local_3d4.sa_data + 6,0,8);
  iVar1 = connect(local_1f8,&local_3d4,0x10);
  if (iVar1 == -1) {
    std::__cxx11::stringstream::stringstream(local_560);
    poVar2 = std::operator<<(local_550,"connect(");
    poVar2 = std::operator<<(poVar2,local_8);
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a);
    poVar2 = std::operator<<(poVar2,"): ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<((ostream *)&std::cerr,local_580);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_580);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::runtime_error::runtime_error(prVar5,pcVar4);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_1f8;
}

Assistant:

int open_socket(const char* host, unsigned short port)
{
  hostent* he;
  he = gethostbyname(host);

  if (he == nullptr)
  {
    stringstream msg;
    msg << "gethostbyname(" << host << "): " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  int sd = socket(PF_INET, SOCK_STREAM, 0);
  if (sd == -1)
  {
    stringstream msg;
    msg << "socket: " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = htons(port);
  far_end.sin_addr = *(in_addr*)(he->h_addr);
  memset(&far_end.sin_zero, '\0', 8);
  if (connect(sd, (sockaddr*)&far_end, sizeof(far_end)) == -1)
  {
    stringstream msg;
    msg << "connect(" << host << ':' << port << "): " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  return sd;
}